

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O3

double * SoapySDRDevice_listSampleRates
                   (SoapySDRDevice *device,int direction,size_t channel,size_t *length)

{
  undefined1 *puVar1;
  double *__dest;
  void *pvVar2;
  void *local_48;
  void *local_40;
  
  *length = 0;
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014ce88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  (**(code **)(*(long *)device + 0x208))(&local_48,device,direction,channel);
  __dest = callocArrayType<double>((long)local_40 - (long)local_48 >> 3);
  pvVar2 = local_48;
  if ((long)local_40 - (long)local_48 != 0) {
    memmove(__dest,local_48,(long)local_40 - (long)local_48);
    pvVar2 = local_40;
  }
  *length = (long)pvVar2 - (long)local_48 >> 3;
  if (local_48 != (void *)0x0) {
    operator_delete(local_48);
  }
  return __dest;
}

Assistant:

double *SoapySDRDevice_listSampleRates(const SoapySDRDevice *device, const int direction, const size_t channel, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toNumericList(device->listSampleRates(direction, channel), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}